

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O1

void __thiscall
BssSectionImport_ZeroSizeSuccess_Test::TestBody(BssSectionImport_ZeroSizeSuccess_Test *this)

{
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *pcVar1;
  not_null<pstore::repo::section_content_*> expected_predicate_value;
  pointer *__ptr_2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  section_content imported_content;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffd68;
  AssertHelper local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  undefined1 local_280 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  AssertHelper local_260;
  undefined1 local_258 [8];
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  _Stack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  __uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_238;
  __uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_> _Stack_230
  ;
  _List_node_base local_228;
  pointer local_218;
  element_type *peStack_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  __node_base _Stack_200;
  uint64_t local_1f8;
  size_t sStack_1f0;
  size_t local_1e8;
  mutex_type *apmStack_1e0 [2];
  undefined1 local_1d0 [8];
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  local_1c8;
  not_null<pstore::repo::section_content_*> local_1a8;
  section_content local_1a0;
  parser<pstore::exchange::import_ns::callbacks> local_c0;
  
  local_1d0 = (undefined1  [8])&local_1c8;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.kind = text;
  local_1a0.align = '\x01';
  memset(&local_1a0.data,0,0xa0);
  local_1a0.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280 = (undefined1  [8])&local_270;
  local_1a0.data.buffer_ = local_1a0.data.small_buffer_._M_elems;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,"{ \"align\":8, \"size\":0 }","");
  local_248._8_8_ = (long)local_248._M_local_buf + 8;
  local_248._M_allocated_capacity = 0;
  local_1e8 = 0;
  apmStack_1e0[0] = (mutex_type *)0x0;
  local_258 = (undefined1  [8])0x0;
  _Stack_250._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       (tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )(_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          )0x0;
  local_228._M_next = &local_228;
  _Stack_230._M_t.
  super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
       (tuple<pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
       (_Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
       0x0;
  local_218 = (pointer)0x0;
  peStack_210 = (element_type *)apmStack_1e0;
  local_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  _Stack_200._M_nxt = (_Hash_node_base *)0x0;
  local_1f8 = 0;
  sStack_1f0 = 0x3f800000;
  local_1a8.ptr_ = &local_1a0;
  local_238._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
        )(tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
          )local_248._8_8_;
  local_228._M_prev = local_228._M_next;
  pstore::gsl::not_null<pstore::repo::section_content_*>::ensure_invariant(&local_1a8);
  expected_predicate_value.ptr_ = local_1a8.ptr_;
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)2,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_c0,(_anonymous_namespace_ *)local_280,
             (string *)&(this->super_BssSectionImport).db_,(database *)local_258,
             (string_mapping *)local_1d0,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)local_1a8.ptr_,
             (not_null<pstore::repo::section_content_*>)in_stack_fffffffffffffd68._M_head_impl);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_258);
  if (local_280 != (undefined1  [8])&local_270) {
    operator_delete((void *)local_280,local_270._M_allocated_capacity + 1);
  }
  local_290.data_._0_1_ = (internal)(local_c0.error_._M_value == 0);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_290.data_._0_1_) {
    local_280[0] = 2;
    testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
              ((internal *)local_258,"imported_content.kind","pstore::repo::section_kind::bss",
               &local_1a0.kind,local_280);
    if (local_258[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_280);
      if ((__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           )_Stack_250._M_t.
            super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
            .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)_Stack_250._M_t.
                           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                           _M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd4,pcVar1);
      testing::internal::AssertHelper::operator=(&local_290,(Message *)local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      if (local_280 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_280 + 8))();
      }
    }
    if (_Stack_250._M_t.
        super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_250._M_t.
                   super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                   .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                   _M_head_impl);
    }
    local_280._0_4_ = 8;
    testing::internal::CmpHelperEQ<unsigned_char,unsigned_int>
              ((internal *)local_258,"imported_content.align","8U",&local_1a0.align,
               (uint *)local_280);
    if (local_258[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_280);
      if ((__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           )_Stack_250._M_t.
            super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
            .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)_Stack_250._M_t.
                           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                           _M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd5,pcVar1);
      testing::internal::AssertHelper::operator=(&local_290,(Message *)local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      if (local_280 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_280 + 8))();
      }
    }
    if (_Stack_250._M_t.
        super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_250._M_t.
                   super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                   .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                   _M_head_impl);
    }
    local_280[0] = (_List_node_base *)local_1a0.data.elements_ == (_List_node_base *)0x0;
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((_List_node_base *)local_1a0.data.elements_ != (_List_node_base *)0x0) {
      testing::Message::Message((Message *)&local_290);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_258,(internal *)local_280,
                 (AssertionResult *)"imported_content.data.empty ()","false","true",
                 (char *)expected_predicate_value.ptr_);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd6,(char *)local_258);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd68,(Message *)&local_290);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd68);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
      }
      if ((long *)CONCAT71(local_290.data_._1_7_,local_290.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_290.data_._1_7_,local_290.data_._0_1_) + 8))();
      }
    }
    if (local_278 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_278,local_278);
    }
    local_280[0] = local_1a0.ifixups.
                   super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   local_1a0.ifixups.
                   super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1a0.ifixups.
        super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1a0.ifixups.
        super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      testing::Message::Message((Message *)&local_290);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_258,(internal *)local_280,
                 (AssertionResult *)"imported_content.ifixups.empty ()","false","true",
                 (char *)expected_predicate_value.ptr_);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd7,(char *)local_258);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd68,(Message *)&local_290);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd68);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
      }
      if ((long *)CONCAT71(local_290.data_._1_7_,local_290.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_290.data_._1_7_,local_290.data_._0_1_) + 8))();
      }
    }
    if (local_278 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_278,local_278);
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_278;
    local_280[0] = local_1a0.xfixups.
                   super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   local_1a0.xfixups.
                   super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __ptr_00 = local_278;
    if (local_1a0.xfixups.
        super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1a0.xfixups.
        super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      testing::Message::Message((Message *)&local_290);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_258,(internal *)local_280,
                 (AssertionResult *)"imported_content.xfixups.empty ()","false","true",
                 (char *)expected_predicate_value.ptr_);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0xd8,(char *)local_258);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd68,(Message *)&local_290);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd68);
      if (local_258 != (undefined1  [8])&local_248) {
        operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
      }
      __ptr_00 = local_278;
      if ((long *)CONCAT71(local_290.data_._1_7_,local_290.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_290.data_._1_7_,local_290.data_._0_1_) + 8))();
        __ptr_00 = local_278;
      }
    }
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_288;
    testing::Message::Message((Message *)&stack0xfffffffffffffd68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&((AssertHelperData *)in_stack_fffffffffffffd68._M_head_impl)->line,
               "JSON error was: ",0x10);
    (**(code **)(*(long *)local_c0.error_._M_cat + 0x20))
              (local_258,local_c0.error_._M_cat,local_c0.error_._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&((AssertHelperData *)in_stack_fffffffffffffd68._M_head_impl)->line,
               (char *)local_258,
               (long)_Stack_250._M_t.
                     super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                     .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                     _M_head_impl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_280,(internal *)&local_290,(AssertionResult *)0x1df922,"true","false"
               ,(char *)expected_predicate_value.ptr_);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0xd2,(char *)local_280);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&stack0xfffffffffffffd68);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (local_280 != (undefined1  [8])&local_270) {
      operator_delete((void *)local_280,local_270._M_allocated_capacity + 1);
    }
    if (local_258 != (undefined1  [8])&local_248) {
      operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
    }
    __ptr_00 = local_288;
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_fffffffffffffd68._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_fffffffffffffd68._M_head_impl + 8))();
      __ptr_00 = local_288;
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.string_._M_dataplus._M_p != &local_c0.string_.field_2) {
    operator_delete(local_c0.string_._M_dataplus._M_p,
                    local_c0.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_c0.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_c0.stack_.c);
  if ((_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       )local_c0.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
        ._M_head_impl !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       )0x0) {
    operator_delete((void *)local_c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if (local_1a0.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

TEST_F (BssSectionImport, ZeroSizeSuccess) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    auto const & parser = parse<pstore::repo::section_kind::bss> (
        R"({ "align":8, "size":0 })", &db_, pstore::exchange::import_ns::string_mapping{},
        &inserter, &imported_content);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    EXPECT_EQ (imported_content.kind, pstore::repo::section_kind::bss);
    EXPECT_EQ (imported_content.align, 8U);
    EXPECT_TRUE (imported_content.data.empty ());
    EXPECT_TRUE (imported_content.ifixups.empty ());
    EXPECT_TRUE (imported_content.xfixups.empty ());
}